

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.c
# Opt level: O3

size_t HUF_decompress1X_usingDTable_bmi2
                 (void *dst,size_t maxDstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable,int bmi2
                 )

{
  undefined1 *puVar1;
  size_t sVar2;
  byte bVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  void *pvVar11;
  bool bVar12;
  
  if (*(char *)((long)DTable + 1) != '\0') {
    sVar2 = HUF_decompress1X2_usingDTable_internal(dst,maxDstSize,cSrc,cSrcSize,DTable,bmi2);
    return sVar2;
  }
  if (bmi2 != 0) {
    sVar2 = HUF_decompress1X1_usingDTable_internal_bmi2(dst,maxDstSize,cSrc,cSrcSize,DTable);
    return sVar2;
  }
  if (cSrcSize == 0) {
    cSrcSize = 0xffffffffffffffb8;
  }
  else if (cSrcSize < 8) {
    uVar5 = (ulong)*cSrc;
    switch(cSrcSize) {
    case 7:
      uVar5 = uVar5 | (ulong)*(byte *)((long)cSrc + 6) << 0x30;
    case 6:
      uVar5 = uVar5 + ((ulong)*(byte *)((long)cSrc + 5) << 0x28);
    case 5:
      uVar5 = uVar5 + ((ulong)*(byte *)((long)cSrc + 4) << 0x20);
    case 4:
      uVar5 = uVar5 + (ulong)*(byte *)((long)cSrc + 3) * 0x1000000;
    case 3:
      uVar5 = uVar5 + (ulong)*(byte *)((long)cSrc + 2) * 0x10000;
    case 2:
      uVar5 = uVar5 + (ulong)*(byte *)((long)cSrc + 1) * 0x100;
    }
    bVar3 = *(byte *)((long)cSrc + (cSrcSize - 1));
    if (bVar3 != 0) {
      uVar8 = 0x1f;
      if (bVar3 != 0) {
        for (; bVar3 >> uVar8 == 0; uVar8 = uVar8 - 1) {
        }
      }
      uVar8 = (uVar8 ^ 0x1f) + (int)cSrcSize * -8 + 0x29;
      lVar9 = 0;
LAB_0015411a:
      puVar1 = (undefined1 *)((long)dst + maxDstSize);
      pvVar11 = (void *)((long)cSrc + lVar9);
      bVar3 = -(char)*(undefined2 *)((long)DTable + 2) & 0x3f;
      do {
        if (lVar9 < 8) {
          if (lVar9 == 0) {
LAB_00154232:
            for (; dst < puVar1; dst = (void *)((long)dst + 1)) {
              uVar7 = (uVar5 << ((byte)uVar8 & 0x3f)) >> bVar3;
              uVar8 = uVar8 + *(byte *)((long)DTable + uVar7 * 2 + 5);
              *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar7 * 2 + 4);
            }
            if (uVar8 != 0x40) {
              maxDstSize = 0xffffffffffffffec;
            }
            if (pvVar11 == cSrc) {
              return maxDstSize;
            }
            return 0xffffffffffffffec;
          }
          uVar4 = uVar8 >> 3;
          bVar12 = cSrc <= (void *)((long)pvVar11 - (ulong)uVar4);
          if (!bVar12) {
            uVar4 = (uint)lVar9;
          }
          uVar8 = uVar8 + uVar4 * -8;
        }
        else {
          uVar4 = uVar8 >> 3;
          uVar8 = uVar8 & 7;
          bVar12 = true;
        }
        lVar9 = lVar9 - (ulong)uVar4;
        pvVar11 = (void *)((long)cSrc + lVar9);
        uVar5 = *(ulong *)((long)cSrc + lVar9);
        if ((puVar1 + -3 <= dst) || (!bVar12)) goto LAB_00154232;
        uVar7 = (uVar5 << ((byte)uVar8 & 0x3f)) >> bVar3;
        iVar6 = *(byte *)((long)DTable + uVar7 * 2 + 5) + uVar8;
        *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar7 * 2 + 4);
        uVar10 = (uVar5 << ((byte)iVar6 & 0x3f)) >> bVar3;
        iVar6 = (uint)*(byte *)((long)DTable + uVar10 * 2 + 5) + iVar6;
        uVar7 = (uVar5 << ((byte)iVar6 & 0x3f)) >> bVar3;
        *(undefined1 *)((long)dst + 1) = *(undefined1 *)((long)DTable + uVar10 * 2 + 4);
        iVar6 = (uint)*(byte *)((long)DTable + uVar7 * 2 + 5) + iVar6;
        uVar10 = (uVar5 << ((byte)iVar6 & 0x3f)) >> bVar3;
        *(undefined1 *)((long)dst + 2) = *(undefined1 *)((long)DTable + uVar7 * 2 + 4);
        uVar8 = (uint)*(byte *)((long)DTable + uVar10 * 2 + 5) + iVar6;
        *(undefined1 *)((long)dst + 3) = *(undefined1 *)((long)DTable + uVar10 * 2 + 4);
        dst = (void *)((long)dst + 4);
        if (0x40 < uVar8) goto LAB_00154232;
      } while( true );
    }
    cSrcSize = 0xffffffffffffffec;
  }
  else {
    bVar3 = *(byte *)((long)cSrc + (cSrcSize - 1));
    if (bVar3 == 0) {
      cSrcSize = 0xffffffffffffffff;
    }
    else if (cSrcSize < 0xffffffffffffff89) {
      uVar5 = *(ulong *)((long)cSrc + (cSrcSize - 8));
      lVar9 = cSrcSize - 8;
      uVar8 = 0x1f;
      if (bVar3 != 0) {
        for (; bVar3 >> uVar8 == 0; uVar8 = uVar8 - 1) {
        }
      }
      uVar8 = ~uVar8 + 9;
      goto LAB_0015411a;
    }
  }
  return cSrcSize;
}

Assistant:

size_t HUF_decompress1X_usingDTable_bmi2(void* dst, size_t maxDstSize, const void* cSrc, size_t cSrcSize, const HUF_DTable* DTable, int bmi2)
{
    DTableDesc const dtd = HUF_getDTableDesc(DTable);
#if defined(HUF_FORCE_DECOMPRESS_X1)
    (void)dtd;
    assert(dtd.tableType == 0);
    return HUF_decompress1X1_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, bmi2);
#elif defined(HUF_FORCE_DECOMPRESS_X2)
    (void)dtd;
    assert(dtd.tableType == 1);
    return HUF_decompress1X2_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, bmi2);
#else
    return dtd.tableType ? HUF_decompress1X2_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, bmi2) :
                           HUF_decompress1X1_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, bmi2);
#endif
}